

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorprint.cc
# Opt level: O2

void benchmark::ColorPrintf(ostream *out,LogColor color,char *fmt,__va_list_tag *args)

{
  ostream *poVar1;
  __va_list_tag *args_00;
  string local_40;
  
  args_00 = args;
  if (color - COLOR_RED < 7) {
    args_00 = (__va_list_tag *)&DAT_0013c6f0;
    FormatString_abi_cxx11_
              (&local_40,"\x1b[0;3%sm",
               &DAT_0013c6f0 + *(int *)(&DAT_0013c6f0 + (ulong)(color - COLOR_RED) * 4));
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  FormatString_abi_cxx11_(&local_40,(benchmark *)fmt,(char *)args,args_00);
  poVar1 = std::operator<<(out,(string *)&local_40);
  std::operator<<(poVar1,"\x1b[m");
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void ColorPrintf(std::ostream& out, LogColor color, const char* fmt, va_list args) {
#ifdef BENCHMARK_OS_WINDOWS
  ((void)out); // suppress unused warning

  const HANDLE stdout_handle = GetStdHandle(STD_OUTPUT_HANDLE);

  // Gets the current text color.
  CONSOLE_SCREEN_BUFFER_INFO buffer_info;
  GetConsoleScreenBufferInfo(stdout_handle, &buffer_info);
  const WORD old_color_attrs = buffer_info.wAttributes;

  // We need to flush the stream buffers into the console before each
  // SetConsoleTextAttribute call lest it affect the text that is already
  // printed but has not yet reached the console.
  fflush(stdout);
  SetConsoleTextAttribute(stdout_handle,
                          GetPlatformColorCode(color) | FOREGROUND_INTENSITY);
  vprintf(fmt, args);

  fflush(stdout);
  // Restores the text color.
  SetConsoleTextAttribute(stdout_handle, old_color_attrs);
#else
  const char* color_code = GetPlatformColorCode(color);
  if (color_code) out << FormatString("\033[0;3%sm", color_code);
  out << FormatString(fmt, args) << "\033[m";
#endif

}